

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O3

void ensureStringBufferCanHold(DString *baseString,size_t newStringSize)

{
  unsigned_long uVar1;
  char *pcVar2;
  char cVar3;
  DString *baseString_00;
  ulong __size;
  bool bVar5;
  ulong uVar4;
  
  __size = baseString->currentStringBufferSize;
  if (__size < newStringSize + 1) {
    baseString_00 = (DString *)&baseString->currentStringBufferSize;
    do {
      uVar4 = __size + 0x6400000;
      bVar5 = 0x6400000 < __size;
      __size = __size * 2;
      if (bVar5) {
        __size = uVar4;
      }
    } while (__size < newStringSize + 1);
    uVar4 = __size;
    pcVar2 = (char *)realloc(baseString->str,__size);
    cVar3 = (char)uVar4;
    if (pcVar2 == (char *)0x0) {
      ensureStringBufferCanHold_cold_1();
      if (cVar3 != '\0' && baseString_00 != (DString *)0x0) {
        ensureStringBufferCanHold(baseString_00,baseString_00->currentStringLength + 1);
        baseString_00->str[baseString_00->currentStringLength] = cVar3;
        uVar1 = baseString_00->currentStringLength;
        baseString_00->currentStringLength = uVar1 + 1;
        baseString_00->str[uVar1 + 1] = '\0';
      }
      return;
    }
    baseString->str = pcVar2;
    baseString->currentStringBufferSize = __size;
  }
  return;
}

Assistant:

static void ensureStringBufferCanHold(DString * baseString, size_t newStringSize) {
	if (baseString) {
		size_t newBufferSizeNeeded = newStringSize + 1;

		if (newBufferSizeNeeded > baseString->currentStringBufferSize) {
			size_t newBufferSize = baseString->currentStringBufferSize;

			while (newBufferSizeNeeded > newBufferSize) {
				if (newBufferSize > kStringBufferMaxIncrement) {
					newBufferSize += kStringBufferMaxIncrement;
				} else {
					newBufferSize *= kStringBufferGrowthMultiplier;
				}
			}

			char * temp;
			temp = realloc(baseString->str, newBufferSize);

			if (temp == NULL) {
				/* realloc failed */
				fprintf(stderr, "Error reallocating memory for d_string. Current buffer size %lu.\n", baseString->currentStringBufferSize);

				exit(1);
			}

			baseString->str = temp;
			baseString->currentStringBufferSize = newBufferSize;
		}
	}
}